

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::(anonymous_namespace)::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *descriptor)

{
  size_type sVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view input;
  string_view proto_file;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pcVar2 = (char *)**(undefined8 **)(this + 8);
  proto_file._M_len = (*(undefined8 **)(this + 8))[1];
  proto_file._M_str = pcVar2;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&proto_file,'/',0xffffffffffffffff);
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&proto_file,(long)((int)sVar1 + 1),0xffffffffffffffff);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_28,'.',0xffffffffffffffff);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_28,0,(long)(int)sVar1);
  input._M_len = bVar3._M_str;
  input._M_str = pcVar2;
  UnderscoresToPascalCase_abi_cxx11_(__return_storage_ptr__,(csharp *)bVar3._M_len,input);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
  const absl::string_view proto_file = descriptor->name();
  int lastslash = proto_file.find_last_of('/');
  const absl::string_view base = proto_file.substr(lastslash + 1);
  return UnderscoresToPascalCase(StripDotProto(base));
}